

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

void test_close_self_no_answer(void)

{
  cio_error cVar1;
  
  cVar1 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,close_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x76a,UNITY_DISPLAY_STYLE_INT);
  cio_buffered_stream_read_at_least_fake.custom_fake = bs_read_at_least_block;
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,"read_message did not succeed",0x76f,UNITY_DISPLAY_STYLE_INT)
  ;
  (*(ws->ws_private).close_timer.handler)
            (&(ws->ws_private).close_timer,(ws->ws_private).close_timer.handler_context,CIO_SUCCESS)
  ;
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x773,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x774,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_val == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not CIO_SUCCESS",
               0x776,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_error_fake.call_count,"error callback was called",0x778,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (0,(ulong)on_control_fake.call_count,
               "control callback was not called for last close frame",0x77a,UNITY_DISPLAY_STYLE_INT)
    ;
    return;
  }
  UnityFail("context of read handler not NULL",0x775);
}

Assistant:

static void test_close_self_no_answer(void)
{
	enum cio_error err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, close_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	cio_buffered_stream_read_at_least_fake.custom_fake = bs_read_at_least_block;

	err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "read_message did not succeed");

	ws->ws_private.close_timer.handler(&ws->ws_private.close_timer, ws->ws_private.close_timer.handler_context, CIO_SUCCESS);

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context of read handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not CIO_SUCCESS");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was not called for last close frame");
}